

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void writeOutput(string *str,string *path)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  int iVar9;
  undefined1 *puVar10;
  size_type sVar11;
  char *pcVar12;
  string realstr;
  string names [100];
  undefined1 *local_db8;
  long local_db0;
  undefined1 local_da8 [16];
  string local_d98;
  char *local_d78;
  long local_d70;
  char local_d68 [16];
  char *local_d58;
  long local_d50;
  char local_d48 [16];
  char *local_d38;
  long local_d30;
  char local_d28 [16];
  char *local_d18;
  long local_d10;
  char local_d08 [16];
  string local_cf8;
  string local_cd8;
  string local_cb8 [99];
  undefined8 auStack_58 [2];
  char local_48 [24];
  
  lVar6 = 0x10;
  do {
    puVar10 = (undefined1 *)((long)&local_cb8[0]._M_dataplus._M_p + lVar6);
    *(undefined1 **)((long)local_cb8 + lVar6 + -0x10) = puVar10;
    *(undefined8 *)((long)local_cb8 + lVar6 + -8) = 0;
    *puVar10 = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0xc90);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cf8,pcVar1,pcVar1 + path->_M_string_length);
  iVar3 = parsePath(&local_cf8,local_cb8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  pcVar1 = (path->_M_dataplus)._M_p;
  local_d18 = local_d08;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d18,pcVar1,pcVar1 + path->_M_string_length);
  iVar4 = doesExist(local_cb8,iVar3,local_d10 == 0 || *local_d18 != '/');
  if (local_d18 != local_d08) {
    operator_delete(local_d18);
  }
  pcVar2 = (str->_M_dataplus)._M_p;
  lVar6 = 0x18;
  pcVar12 = "File content is illegal.";
  if ((*pcVar2 == '\"') && (pcVar2[str->_M_string_length - 1] == '\"')) {
    if (iVar4 == iVar3) {
      pcVar1 = (path->_M_dataplus)._M_p;
      local_d38 = local_d28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d38,pcVar1,pcVar1 + path->_M_string_length);
      iVar4 = getId(local_cb8,iVar3,local_d30 == 0 || *local_d38 != '/');
      if (local_d38 != local_d28) {
        operator_delete(local_d38);
      }
      if (inodes[iVar4].i_mode == 1) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is not a file.\n",0x10);
      }
      else {
        pcVar1 = (path->_M_dataplus)._M_p;
        local_d58 = local_d48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d58,pcVar1,pcVar1 + path->_M_string_length);
        iVar3 = getId(local_cb8,iVar3 + -1,local_d50 == 0 || *local_d58 != '/');
        if (local_d58 != local_d48) {
          operator_delete(local_d58);
        }
        lVar6 = (long)inodes[iVar4].i_blocks[0] * 0x1000;
        memset(emptyspaces + lVar6,0,0x1000);
        sVar11 = str->_M_string_length;
        if (sVar11 - 3 < 0xfffffffffffffffe) {
          uVar8 = 1;
          do {
            *(char *)(lVar6 + 0x12b1ef + uVar8) = (str->_M_dataplus)._M_p[uVar8];
            uVar8 = uVar8 + 1;
            sVar11 = str->_M_string_length;
          } while (uVar8 < sVar11 - 1);
        }
        iVar5 = inodes[iVar4].i_file_size;
        iVar9 = (int)sVar11 + -2;
        inodes[iVar4].i_file_size = iVar9;
        iVar5 = iVar5 - iVar9;
        for (; iVar3 != 0;
            iVar3 = *(int *)(emptyspaces + (long)inodes[iVar3].i_blocks[0] * 0x1000 + 0x1fc)) {
          inodes[iVar3].i_file_size = inodes[iVar3].i_file_size - iVar5;
        }
        inodes[0].i_file_size = inodes[0].i_file_size - iVar5;
      }
      goto LAB_00103d49;
    }
    if (iVar4 + 1 == iVar3) {
      pcVar1 = (path->_M_dataplus)._M_p;
      local_d78 = local_d68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d78,pcVar1,pcVar1 + path->_M_string_length);
      iVar3 = iVar3 + -1;
      iVar4 = getId(local_cb8,iVar3,local_d70 == 0 || *local_d78 != '/');
      if (local_d78 != local_d68) {
        operator_delete(local_d78);
      }
      std::__cxx11::string::substr((ulong)&local_db8,(ulong)str);
      pcVar1 = local_cb8[iVar3]._M_dataplus._M_p;
      local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d98,pcVar1,pcVar1 + local_cb8[iVar3]._M_string_length);
      local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_cd8,local_db8,local_db8 + local_db0);
      iVar3 = makeFileById(iVar4,&local_d98,&local_cd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
        operator_delete(local_d98._M_dataplus._M_p);
      }
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"current folder is full!",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
      }
      if (local_db8 != local_da8) {
        operator_delete(local_db8);
      }
      goto LAB_00103d49;
    }
    lVar6 = 0xd;
    pcVar12 = "Invalid path.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
LAB_00103d49:
  lVar6 = 0;
  do {
    if (local_48 + lVar6 != *(char **)((long)auStack_58 + lVar6)) {
      operator_delete(*(char **)((long)auStack_58 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0xc80);
  return;
}

Assistant:

void writeOutput(string str, string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (str[0] != '\"' || str[str.size() - 1] != '\"') {
        setColor(COLOR_ERR);
        cout << "File content is illegal." << endl;
        setColor(COLOR_ORIGIN);
    }
    else if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);//找到该路径在inode中的i.id
        if (inodes[id].i_mode == A_FOLDER)
        {
            setColor(COLOR_ERR);
            cout << path << " is not a file.\n";
            setColor(COLOR_ORIGIN);
            return;
        }
        int parent_id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//parent id
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        memset(p, '\0', sizeof(File_Block));
        for (int i = 1; i < str.size() - 1; i++) {
            p->data[i - 1] = str[i];
        }
        int origin_size = inodes[id].i_file_size;
        inodes[id].i_file_size = (int) (str.size()) - 2;
        int dsize = origin_size - inodes[id].i_file_size;
        int cur = parent_id;
        while (cur)
        {
            inodes[cur].i_file_size -= dsize;
            cur = getParentById(cur);
        }
        inodes[0].i_file_size -= dsize;
    }
    else if (legal_layers + 1 == layers) {
        int id = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);//找到要创建文件所在目录的inode中的i.id
        string realstr = str.substr(1, str.size() - 2);
        if(makeFileById(id, names[layers - 1], realstr) == 0){
            cout << "current folder is full!" << endl;
            return;
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;
        setColor(COLOR_ORIGIN);
    }
}